

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightLeSample * __thiscall
pbrt::DistantLight::SampleLe
          (LightLeSample *__return_storage_ptr__,DistantLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  float fVar1;
  Float a;
  undefined1 auVar2 [16];
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar12 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined8 uVar11;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar15 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  Vector3<float> VVar16;
  Vector3f VVar17;
  Point3<float> PVar18;
  SampledSpectrum SVar19;
  Frame wFrame;
  SampledSpectrum local_b8;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  Tuple3<pbrt::Vector3,_float> local_78;
  Vector3f local_68;
  Frame local_58;
  undefined8 uVar10;
  undefined1 extraout_var [56];
  
  auVar12 = in_register_00001204._4_56_;
  local_b8.values.values[3] = local_b8.values.values[1];
  local_b8.values.values._0_12_ = ZEXT412(0x3f800000) << 0x40;
  VVar16 = Transform::operator()
                     (&(this->super_LightBase).renderFromLight,(Vector3<float> *)&local_b8);
  local_58.x.super_Tuple3<pbrt::Vector3,_float>.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar12;
  local_58.x.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar5._0_16_);
  VVar16 = Normalize<float>(&local_58.x);
  local_68.super_Tuple3<pbrt::Vector3,_float>.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar12;
  local_68.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar6._0_16_);
  Frame::FromZ(&local_58,&local_68);
  auVar7._0_8_ = SampleUniformDiskConcentric(u1);
  uVar10 = extraout_var._0_8_;
  auVar7._8_56_ = extraout_var;
  fVar1 = this->sceneRadius;
  local_78._0_8_ = vmovlps_avx(auVar7._0_16_);
  local_78.z = 0.0;
  VVar17 = Frame::FromLocal(&local_58,(Vector3f *)&local_78);
  auVar4._0_4_ = fVar1 * VVar17.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar4._4_4_ = fVar1 * VVar17.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar4._8_4_ = fVar1 * (float)uVar10;
  auVar4._12_4_ = fVar1 * (float)((ulong)uVar10 >> 0x20);
  uVar11 = auVar4._8_8_;
  uVar10 = vmovlps_avx(auVar4);
  local_b8.values.values[2] = fVar1 * VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  local_b8.values.values[0] = (float)(int)uVar10;
  local_b8.values.values[1] = (float)(int)((ulong)uVar10 >> 0x20);
  PVar18 = Point3<float>::operator+(&this->sceneCenter,(Vector3<float> *)&local_b8);
  fVar1 = this->sceneRadius;
  fVar3 = fVar1 * local_68.super_Tuple3<pbrt::Vector3,_float>.z;
  local_88 = PVar18.super_Tuple3<pbrt::Point3,_float>.x +
             fVar1 * local_68.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_84 = PVar18.super_Tuple3<pbrt::Point3,_float>.y +
              fVar1 * local_68.super_Tuple3<pbrt::Vector3,_float>.y;
  fStack_80 = (float)uVar11 + fVar1 * 0.0;
  fStack_7c = (float)((ulong)uVar11 >> 0x20) + fVar1 * 0.0;
  local_98._0_8_ = local_68.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
  local_98._8_4_ = 0x80000000;
  local_98._12_4_ = 0x80000000;
  auVar15 = ZEXT856(local_98._8_8_);
  local_a8 = -local_68.super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_a4 = 0x80000000;
  uStack_a0 = 0x80000000;
  uStack_9c = 0x80000000;
  a = this->scale;
  auVar12 = (undefined1  [56])0x0;
  SVar19 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar13._0_8_ = SVar19.values.values._8_8_;
  auVar13._8_56_ = auVar15;
  auVar8._0_8_ = SVar19.values.values._0_8_;
  auVar8._8_56_ = auVar12;
  local_b8.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar13._0_16_);
  auVar12 = (undefined1  [56])0x0;
  SVar19 = SampledSpectrum::operator*(&local_b8,a);
  auVar14._0_8_ = SVar19.values.values._8_8_;
  auVar14._8_56_ = auVar15;
  auVar9._0_8_ = SVar19.values.values._0_8_;
  auVar9._8_56_ = auVar12;
  auVar2 = vmovlhps_avx(auVar9._0_16_,auVar14._0_16_);
  fVar1 = this->sceneRadius;
  *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar2;
  auVar2._4_4_ = fStack_84;
  auVar2._0_4_ = local_88;
  auVar2._8_4_ = fStack_80;
  auVar2._12_4_ = fStack_7c;
  uVar10 = vmovlps_avx(auVar2);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar10;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar10 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       PVar18.super_Tuple3<pbrt::Point3,_float>.z + fVar3;
  uVar10 = vmovlps_avx(local_98);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar10;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar10 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0 / (fVar1 * fVar1 * 3.1415927);
  __return_storage_ptr__->pdfDir = 1.0;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample DistantLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                     SampledWavelengths &lambda, Float time) const {
    // Choose point on disk oriented toward infinite light direction
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    Frame wFrame = Frame::FromZ(w);
    Point2f cd = SampleUniformDiskConcentric(u1);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));

    // Compute _DistantLight_ light ray
    Ray ray(pDisk + sceneRadius * w, -w, time);

    return LightLeSample(scale * Lemit.Sample(lambda), ray,
                         1 / (Pi * sceneRadius * sceneRadius), 1);
}